

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O3

handle pybind11::detail::
       eigen_map_caster<Eigen::Ref<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>_>
       ::cast(Ref<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> *src,
             return_value_policy policy,handle parent)

{
  handle hVar1;
  undefined7 in_register_00000031;
  object local_10;
  
  switch(CONCAT71(in_register_00000031,policy) & 0xffffffff) {
  case 0:
  case 1:
  case 5:
    local_10.super_handle.m_ptr = (handle)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    hVar1 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>>>
                      (src,(PyObject *)&_Py_NoneStruct,true);
    object::~object(&local_10);
    return (handle)hVar1.m_ptr;
  default:
    pybind11_fail("Invalid return_value_policy for Eigen Map/Ref/Block type");
  case 3:
    parent.m_ptr = (PyObject *)0x0;
    break;
  case 6:
  }
  hVar1 = eigen_array_cast<pybind11::detail::EigenProps<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>,0,Eigen::OuterStride<_1>>>>
                    (src,parent,true);
  return (handle)hVar1.m_ptr;
}

Assistant:

static handle cast(const MapType &src, return_value_policy policy, handle parent) {
        switch (policy) {
            case return_value_policy::copy:
                return eigen_array_cast<props>(src);
            case return_value_policy::reference_internal:
                return eigen_array_cast<props>(src, parent, is_eigen_mutable_map<MapType>::value);
            case return_value_policy::reference:
            case return_value_policy::automatic:
            case return_value_policy::automatic_reference:
                return eigen_array_cast<props>(src, none(), is_eigen_mutable_map<MapType>::value);
            default:
                // move, take_ownership don't make any sense for a ref/map:
                pybind11_fail("Invalid return_value_policy for Eigen Map/Ref/Block type");
        }
    }